

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  Type *pTVar1;
  Message *to;
  
  pTVar1 = value;
  if (value_arena == (Arena *)0x0 && my_arena != (Arena *)0x0) {
    if (value != (Type *)0x0) {
      ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)my_arena,value,
                 arena_delete_object<google::protobuf::MessageLite>);
    }
  }
  else if (my_arena != value_arena) {
    pTVar1 = GenericTypeHandler<google::protobuf::Message>::NewFromPrototype(value,my_arena);
    GenericTypeHandler<google::protobuf::Message>::Merge
              ((GenericTypeHandler<google::protobuf::Message> *)value,pTVar1,to);
    if (value_arena == (Arena *)0x0) {
      (*(value->super_MessageLite)._vptr_MessageLite[1])(value);
    }
  }
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (this,pTVar1);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != nullptr && value_arena == nullptr) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}